

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExpandSubquery(Parse *pParse,SrcList_item *pFrom)

{
  Select *pSVar1;
  int iVar2;
  Table *pTVar3;
  char *pcVar4;
  Select *pSVar5;
  
  pSVar1 = pFrom->pSelect;
  pTVar3 = (Table *)sqlite3DbMallocZero(pParse->db,0x80);
  pFrom->pTab = pTVar3;
  if (pTVar3 == (Table *)0x0) {
    iVar2 = 7;
  }
  else {
    pTVar3->nTabRef = 1;
    if (pFrom->zAlias == (char *)0x0) {
      pcVar4 = sqlite3MPrintf(pParse->db,"subquery_%u",(ulong)pSVar1->selId);
    }
    else {
      pcVar4 = sqlite3DbStrDup(pParse->db,pFrom->zAlias);
    }
    pTVar3->zName = pcVar4;
    do {
      pSVar5 = pSVar1;
      pSVar1 = pSVar5->pPrior;
    } while (pSVar1 != (Select *)0x0);
    sqlite3ColumnsFromExprList((Parse *)pParse->db,pSVar5->pEList,&pTVar3->nCol,&pTVar3->aCol);
    pTVar3->iPKey = -1;
    pTVar3->nRowLogEst = 200;
    *(byte *)&pTVar3->tabFlags = (byte)pTVar3->tabFlags | 2;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExpandSubquery(Parse *pParse, struct SrcList_item *pFrom){
  Select *pSel = pFrom->pSelect;
  Table *pTab;

  assert( pSel );
  pFrom->pTab = pTab = sqlite3DbMallocZero(pParse->db, sizeof(Table));
  if( pTab==0 ) return SQLITE_NOMEM;
  pTab->nTabRef = 1;
  if( pFrom->zAlias ){
    pTab->zName = sqlite3DbStrDup(pParse->db, pFrom->zAlias);
  }else{
    pTab->zName = sqlite3MPrintf(pParse->db, "subquery_%u", pSel->selId);
  }
  while( pSel->pPrior ){ pSel = pSel->pPrior; }
  sqlite3ColumnsFromExprList(pParse, pSel->pEList,&pTab->nCol,&pTab->aCol);
  pTab->iPKey = -1;
  pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  pTab->tabFlags |= TF_Ephemeral;

  return SQLITE_OK;
}